

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::ifthenelse_else(Forth *this)

{
  Cell CVar1;
  CAddr x;
  uint pointer;
  CAddr CVar2;
  uint ifHere;
  CAddr elseHere;
  Cell controlStackSize;
  Forth *this_local;
  
  CVar1 = ForthStack<unsigned_int>::stackDepth(&this->controlStackIf_Begin);
  data(this,5);
  x = getDataPointer(this);
  data(this,this->CellSize);
  if (CVar1 == 0) {
    ForthStack<unsigned_int>::push(&this->controlStackIf_Begin,x);
  }
  else {
    pointer = ForthStack<unsigned_int>::getTop(&this->controlStackIf_Begin);
    CVar2 = getDataPointer(this);
    setDataCell(this,pointer,CVar2 - pointer);
    ForthStack<unsigned_int>::setTop(&this->controlStackIf_Begin,x);
  }
  return;
}

Assistant:

void ifthenelse_else() {
			auto controlStackSize = controlStackIf_Begin.stackDepth();
			data(branchXt);
			auto elseHere = getDataPointer();
			data(CellSize);
			if (controlStackSize > 0){
				auto ifHere = controlStackIf_Begin.getTop();
				setDataCell(ifHere, Cell(getDataPointer() - ifHere));
				controlStackIf_Begin.setTop(elseHere);
			}
			else {
				controlStackIf_Begin.push(elseHere); // else without forward reference
			}
		}